

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_add_golas_heart.cpp
# Opt level: O3

Map * add_gh_stairs_room(RandomizerWorld *world,MapPalette *pal,uint16_t map_id)

{
  undefined8 in_RAX;
  Map *this;
  mapped_type *ppMVar1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  this = (Map *)operator_new(0xe0);
  uStack_28 = CONCAT26(0xda,(undefined6)uStack_28);
  ppMVar1 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(&(world->super_World)._maps,(key_type *)((long)&uStack_28 + 6));
  Map::Map(this,*ppMVar1);
  Map::clear_entities(this);
  this->_id = map_id;
  this->_palette = pal;
  this->_background_music = '\x12';
  World::add_map(&world->super_World,this);
  return this;
}

Assistant:

static Map* add_gh_stairs_room(RandomizerWorld& world, MapPalette* pal, uint16_t map_id)
{
    Map* map = new Map(*world.map(MAP_THIEVES_HIDEOUT_218));
    map->clear_entities();
    map->id(map_id);
    map->palette(pal);
    map->background_music(18);

    world.add_map(map);
    return map;
}